

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::AtomicBenchmark<(std::memory_order)5>::GetName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_1a;
  undefined1 local_19;
  void *local_18;
  AtomicBenchmark<(std::memory_order)5> *this_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  this_local = (AtomicBenchmark<(std::memory_order)5> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Atomic Benchmark (",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  anon_unknown.dwarf_e77e::GetMemoryOrderRepr(memory_order_seq_cst);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]]
  std::string GetName() const noexcept override {
    std::string name = "Atomic Benchmark (";
    name.append(GetMemoryOrderRepr(Order));
    name.append(")");
    return name;
  }